

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float64 helper_recpe_f64_aarch64(float64 input,void *fpstp)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  float64 local_50;
  float64 nan;
  uint64_t f64_frac;
  int f64_exp;
  _Bool f64_sign;
  uint64_t f64_val;
  float64 f64;
  float_status *fpst;
  void *fpstp_local;
  float64 input_local;
  
  f64 = (float64)fpstp;
  fpst = (float_status *)fpstp;
  fpstp_local = (void *)input;
  _f64_exp = float64_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  f64_val = _f64_exp;
  iVar2 = float64_is_neg(_f64_exp);
  f64_frac._7_1_ = iVar2 != 0;
  uVar3 = extract64(_f64_exp,0x34,0xb);
  f64_frac._0_4_ = (int)uVar3;
  uVar3 = extract64(_f64_exp,0,0x34);
  iVar2 = float64_is_any_nan(f64_val);
  if (iVar2 == 0) {
    iVar2 = float64_is_infinity(f64_val);
    if (iVar2 == 0) {
      iVar2 = float64_is_zero(f64_val);
      if (iVar2 == 0) {
        if ((_f64_exp & 0x7fffffffffffffff) < 0x4000000000000) {
          float_raise_aarch64('(',(float_status *)f64);
          _Var1 = round_to_inf((float_status *)f64,(_Bool)(f64_frac._7_1_ & 1));
          if (_Var1) {
            input_local = float64_set_sign(0x7ff0000000000000,(uint)(f64_frac._7_1_ & 1));
          }
          else {
            input_local = float64_set_sign(0x7fefffffffffffff,(uint)(f64_frac._7_1_ & 1));
          }
        }
        else if (((int)f64_frac < 0x7fd) || (*(char *)(f64 + 4) == '\0')) {
          uVar3 = call_recip_estimate((int *)&f64_frac,0x7fd,uVar3);
          _f64_exp = deposit64(0,0x3f,1,(ulong)(f64_frac._7_1_ & 1));
          _f64_exp = deposit64(_f64_exp,0x34,0xb,(long)(int)f64_frac);
          input_local = deposit64(_f64_exp,0,0x34,uVar3);
        }
        else {
          float_raise_aarch64('\x10',(float_status *)f64);
          iVar2 = float64_is_neg(f64_val);
          input_local = float64_set_sign(0,iVar2);
        }
      }
      else {
        float_raise_aarch64('\x04',(float_status *)f64);
        iVar2 = float64_is_neg(f64_val);
        input_local = float64_set_sign(0x7ff0000000000000,iVar2);
      }
    }
    else {
      iVar2 = float64_is_neg(f64_val);
      input_local = float64_set_sign(0,iVar2);
    }
  }
  else {
    local_50 = f64_val;
    iVar2 = float64_is_signaling_nan_aarch64(f64_val,(float_status *)f64);
    if (iVar2 != 0) {
      float_raise_aarch64('\x01',(float_status *)f64);
      local_50 = float64_silence_nan_aarch64(f64_val,(float_status *)f64);
    }
    if (*(char *)(f64 + 6) != '\0') {
      local_50 = float64_default_nan_aarch64((float_status *)f64);
    }
    input_local = local_50;
  }
  return input_local;
}

Assistant:

float64 HELPER(recpe_f64)(float64 input, void *fpstp)
{
    float_status *fpst = fpstp;
    float64 f64 = float64_squash_input_denormal(input, fpst);
    uint64_t f64_val = float64_val(f64);
    bool f64_sign = float64_is_neg(f64);
    int f64_exp = extract64(f64_val, 52, 11);
    uint64_t f64_frac = extract64(f64_val, 0, 52);

    /* Deal with any special cases */
    if (float64_is_any_nan(f64)) {
        float64 nan = f64;
        if (float64_is_signaling_nan(f64, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float64_silence_nan(f64, fpst);
        }
        if (fpst->default_nan_mode) {
            nan =  float64_default_nan(fpst);
        }
        return nan;
    } else if (float64_is_infinity(f64)) {
        return float64_set_sign(float64_zero, float64_is_neg(f64));
    } else if (float64_is_zero(f64)) {
        float_raise(float_flag_divbyzero, fpst);
        return float64_set_sign(float64_infinity, float64_is_neg(f64));
    } else if ((f64_val & ~(1ULL << 63)) < (1ULL << 50)) {
        /* Abs(value) < 2.0^-1024 */
        float_raise(float_flag_overflow | float_flag_inexact, fpst);
        if (round_to_inf(fpst, f64_sign)) {
            return float64_set_sign(float64_infinity, f64_sign);
        } else {
            return float64_set_sign(float64_maxnorm, f64_sign);
        }
    } else if (f64_exp >= 2045 && fpst->flush_to_zero) {
        float_raise(float_flag_underflow, fpst);
        return float64_set_sign(float64_zero, float64_is_neg(f64));
    }

    f64_frac = call_recip_estimate(&f64_exp, 2045, f64_frac);

    /* result = sign : result_exp<10:0> : fraction<51:0>; */
    f64_val = deposit64(0, 63, 1, f64_sign);
    f64_val = deposit64(f64_val, 52, 11, f64_exp);
    f64_val = deposit64(f64_val, 0, 52, f64_frac);
    return make_float64(f64_val);
}